

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_tsfb.c
# Opt level: O0

int jpc_tsfb_synthesize2
              (jpc_tsfb_t *tsfb,jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride,
              int numlvls)

{
  int iVar1;
  int height_local;
  int width_local;
  int ystart_local;
  int xstart_local;
  jpc_fix_t *a_local;
  jpc_tsfb_t *tsfb_local;
  
  if ((numlvls < 1) ||
     (iVar1 = jpc_tsfb_synthesize2
                        (tsfb,a,xstart + 1 >> 1,ystart + 1 >> 1,
                         (xstart + width + 1 >> 1) - (xstart + 1 >> 1),
                         (ystart + height + 1 >> 1) - (ystart + 1 >> 1),stride,numlvls + -1),
     iVar1 == 0)) {
    if (((width < 1) || (height < 1)) ||
       (iVar1 = (*tsfb->qmfb->synthesize)(a,xstart,ystart,width,height,stride), iVar1 == 0)) {
      tsfb_local._4_4_ = 0;
    }
    else {
      tsfb_local._4_4_ = -1;
    }
  }
  else {
    tsfb_local._4_4_ = -1;
  }
  return tsfb_local._4_4_;
}

Assistant:

static int jpc_tsfb_synthesize2(jpc_tsfb_t *tsfb, jpc_fix_t *a, int xstart, int ystart,
  int width, int height, int stride, int numlvls)
{
	if (numlvls > 0) {
		if (jpc_tsfb_synthesize2(tsfb, a, JPC_CEILDIVPOW2(xstart, 1),
		  JPC_CEILDIVPOW2(ystart, 1), JPC_CEILDIVPOW2(xstart + width,
		  1) - JPC_CEILDIVPOW2(xstart, 1), JPC_CEILDIVPOW2(ystart +
		  height, 1) - JPC_CEILDIVPOW2(ystart, 1), stride, numlvls -
		  1)) {
			return -1;
		}
	}
	if (width > 0 && height > 0) {
		if ((*tsfb->qmfb->synthesize)(a, xstart, ystart, width, height, stride)) {
			return -1;
		}
	}
	return 0;
}